

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_benchmarker.hpp
# Opt level: O0

vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_> * __thiscall
hayai::Benchmarker::GetTests
          (vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>
           *__return_storage_ptr__,Benchmarker *this)

{
  size_type sVar1;
  const_reference __x;
  ulong local_28;
  size_t index;
  Benchmarker *this_local;
  vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_> *tests;
  
  inja::std::vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>::vector
            (__return_storage_ptr__);
  local_28 = 0;
  while (sVar1 = inja::std::
                 vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>::size
                           (&this->_tests), local_28 < sVar1) {
    __x = inja::std::vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>::
          operator[](&this->_tests,local_28);
    inja::std::vector<hayai::TestDescriptor_*,_std::allocator<hayai::TestDescriptor_*>_>::push_back
              (__return_storage_ptr__,__x);
    local_28 = local_28 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestDescriptor*> GetTests() const
        {
            std::vector<TestDescriptor*> tests;

            std::size_t index = 0;
            while (index < _tests.size())
                tests.push_back(_tests[index++]);

            return tests;
        }